

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool __thiscall
google::anon_unknown_8::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  FileDescriptor __fd;
  int iVar1;
  FILE *__p;
  char *pcVar2;
  bool bVar3;
  _Alloc_hider __from;
  FileDescriptor fd;
  string linkpath;
  string string_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string linkname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&string_filename,(string *)&this->base_filename_);
  if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
    std::__cxx11::string::append((string *)&string_filename);
  }
  std::__cxx11::string::append((string *)&string_filename);
  fd.fd_ = open(string_filename._M_dataplus._M_p,
                (uint)fLB::FLAGS_timestamp_in_logfile_name << 7 | 0x41,
                (ulong)fLI::FLAGS_logfile_mode);
  if (fd.fd_ != -1) {
    fcntl(fd.fd_,2,1);
    CreateLogfile::w_lock.l_type = 1;
    CreateLogfile::w_lock.l_whence = 0;
    CreateLogfile::w_lock.l_start = 0;
    CreateLogfile::w_lock.l_len = 0;
    iVar1 = fcntl(fd.fd_,6,&CreateLogfile::w_lock);
    __fd = fd;
    if (iVar1 != -1) {
      fd.fd_ = -1;
      __p = fdopen(__fd.fd_,"a");
      std::__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset
                ((__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_> *)&this->file_,
                 (pointer)__p);
      if ((this->file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
          super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl != (_IO_FILE *)0x0) {
        bVar3 = true;
        if ((this->symlink_basename_)._M_string_length != 0) {
          pcVar2 = strrchr(string_filename._M_dataplus._M_p,0x2f);
          std::operator+(&linkpath,&this->symlink_basename_,'.');
          std::operator+(&linkname,&linkpath,
                         *(char **)(LogSeverityNames + (ulong)this->severity_ * 8));
          std::__cxx11::string::~string((string *)&linkpath);
          linkpath._M_dataplus._M_p = (pointer)&linkpath.field_2;
          linkpath._M_string_length = 0;
          linkpath.field_2._M_local_buf[0] = '\0';
          if (pcVar2 != (char *)0x0) {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,string_filename._M_dataplus._M_p,pcVar2 + 1);
            std::__cxx11::string::operator=((string *)&linkpath,(string *)&local_88);
            std::__cxx11::string::~string((string *)&local_88);
          }
          std::__cxx11::string::append((string *)&linkpath);
          unlink(linkpath._M_dataplus._M_p);
          __from._M_p = pcVar2 + 1;
          if (pcVar2 == (char *)0x0) {
            __from = string_filename._M_dataplus;
          }
          symlink(__from._M_p,linkpath._M_dataplus._M_p);
          if (fLS::FLAGS_log_link_buf_abi_cxx11_._8_8_ != 0) {
            std::operator+(&local_48,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           fLS::FLAGS_log_link_buf_abi_cxx11_,"/");
            std::operator+(&local_88,&local_48,&linkname);
            std::__cxx11::string::operator=((string *)&linkpath,(string *)&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            std::__cxx11::string::~string((string *)&local_48);
            unlink(linkpath._M_dataplus._M_p);
            symlink(string_filename._M_dataplus._M_p,linkpath._M_dataplus._M_p);
          }
          std::__cxx11::string::~string((string *)&linkpath);
          std::__cxx11::string::~string((string *)&linkname);
        }
        goto LAB_0011a98b;
      }
      if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
        unlink(string_filename._M_dataplus._M_p);
      }
    }
  }
  bVar3 = false;
LAB_0011a98b:
  glog_internal_namespace_::FileDescriptor::safe_close(&fd);
  std::__cxx11::string::~string((string *)&string_filename);
  return bVar3;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  string string_filename = base_filename_;
  if (FLAGS_timestamp_in_logfile_name) {
    string_filename += time_pid_string;
  }
  string_filename += filename_extension_;
  const char* filename = string_filename.c_str();
  // only write to files, create if non-existant.
  int flags = O_WRONLY | O_CREAT;
  if (FLAGS_timestamp_in_logfile_name) {
    // demand that the file is unique for our timestamp (fail if it exists).
    flags = flags | O_EXCL;
  }
  FileDescriptor fd{
      open(filename, flags, static_cast<mode_t>(FLAGS_logfile_mode))};
  if (!fd) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd.get(), F_SETFD, FD_CLOEXEC);

  // Mark the file as exclusive write access to avoid two clients logging to the
  // same file. This applies particularly when !FLAGS_timestamp_in_logfile_name
  // (otherwise open would fail because the O_EXCL flag on similar filename).
  // locks are released on unlock or close() automatically, only after log is
  // released.
  // This will work after a fork as it is not inherited (not stored in the fd).
  // Lock will not be lost because the file is opened with exclusive lock
  // (write) and we will never read from it inside the process.
  // TODO: windows implementation of this (as flock is not available on
  // mingw).
  static struct flock w_lock;

  w_lock.l_type = F_WRLCK;
  w_lock.l_start = 0;
  w_lock.l_whence = SEEK_SET;
  w_lock.l_len = 0;

  int wlock_ret = fcntl(fd.get(), F_SETLK, &w_lock);
  if (wlock_ret == -1) {
    return false;
  }
#endif

  // fdopen in append mode so if the file exists it will fseek to the end
  file_.reset(fdopen(fd.release(), "a"));  // Make a FILE*.
  if (file_ == nullptr) {                  // Man, we're screwed!
    if (FLAGS_timestamp_in_logfile_name) {
      unlink(filename);  // Erase the half-baked evidence: an unusable log file,
                         // only if we just created it.
    }
    return false;
  }
#ifdef GLOG_OS_WINDOWS
  // https://github.com/golang/go/issues/27638 - make sure we seek to the end to
  // append empirically replicated with wine over mingw build
  if (!FLAGS_timestamp_in_logfile_name) {
    if (fseek(file_.get(), 0, SEEK_END) != 0) {
      return false;
    }
  }
#endif
  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
        symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if (slash)
      linkpath = string(
          filename, static_cast<size_t>(slash - filename + 1));  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());  // delete old one if it exists

#if defined(GLOG_OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char* linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}